

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,char *s,format_specs<char> *specs,locale_ref param_4)

{
  size_t sVar1;
  unsigned_long in_RCX;
  long in_RDX;
  format_specs<char> *in_RSI;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_RDI;
  format_specs<char> *in_stack_ffffffffffffff98;
  basic_string_view<char> in_stack_ffffffffffffffa8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_20;
  
  if (*(char *)(in_RDX + 8) == '\x11') {
    bit_cast<unsigned_long,_const_char_*,_0>((char **)&stack0xffffffffffffffc8);
    local_20.container =
         (buffer<char> *)
         write_ptr<char,fmt::v10::appender,unsigned_long>(in_RDI.container,in_RCX,in_RSI);
  }
  else {
    sVar1 = std::char_traits<char>::length((char_type *)0x1d5461);
    local_20.container =
         (buffer<char> *)
         write<char,fmt::v10::appender>
                   (in_RDI.container,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff98,
                    (locale_ref)0x0);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_20.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return specs.type != presentation_type::pointer
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
}